

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

int insertkey(Table *t,TValue *key,TValue *value)

{
  lu_byte lVar1;
  undefined2 uVar2;
  int iVar3;
  Node *nd;
  TValue *io2;
  TValue *io1;
  TValue *io_;
  Node *n_;
  Node *f;
  Node *othern;
  Node *mp;
  TValue *value_local;
  TValue *key_local;
  Table *t_local;
  
  nd = mainpositionTV(t,key);
  if ((((nd->u).tt_ & 0xf) != 0) || (othern = nd, (t->flags & 0x40) != 0)) {
    othern = getfreepos(t);
    if (othern == (Node *)0x0) {
      return 0;
    }
    f = mainpositionfromnode(t,nd);
    if (f == nd) {
      if ((nd->u).next != 0) {
        (othern->u).next = (int)(((long)nd + ((long)(nd->u).next * 0x18 - (long)othern)) / 0x18);
      }
      (nd->u).next = (int)(((long)othern - (long)nd) / 0x18);
    }
    else {
      for (; f + (f->u).next != nd; f = f + (f->u).next) {
      }
      (f->u).next = (int)(((long)othern - (long)f) / 0x18);
      (othern->u).value_ = (nd->u).value_;
      lVar1 = *(lu_byte *)((long)nd + 9);
      uVar2 = *(undefined2 *)((long)nd + 10);
      iVar3 = *(int *)((long)nd + 0xc);
      *(lu_byte *)((long)othern + 8) = *(lu_byte *)((long)nd + 8);
      *(lu_byte *)((long)othern + 9) = lVar1;
      *(undefined2 *)((long)othern + 10) = uVar2;
      *(int *)((long)othern + 0xc) = iVar3;
      (othern->u).key_val = (nd->u).key_val;
      if ((nd->u).next != 0) {
        (othern->u).next = (int)(((long)nd - (long)othern) / 0x18) + (othern->u).next;
        (nd->u).next = 0;
      }
      (nd->u).tt_ = '\x10';
      othern = nd;
    }
  }
  (othern->u).key_val = key->value_;
  (othern->u).key_tt = key->tt_;
  (othern->u).value_ = value->value_;
  (othern->u).tt_ = value->tt_;
  return 1;
}

Assistant:

static int insertkey (Table *t, const TValue *key, TValue *value) {
  Node *mp = mainpositionTV(t, key);
  /* table cannot already contain the key */
  lua_assert(isabstkey(getgeneric(t, key, 0)));
  if (!isempty(gval(mp)) || isdummy(t)) {  /* main position is taken? */
    Node *othern;
    Node *f = getfreepos(t);  /* get a free place */
    if (f == NULL)  /* cannot find a free place? */
      return 0;
    lua_assert(!isdummy(t));
    othern = mainpositionfromnode(t, mp);
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (othern + gnext(othern) != mp)  /* find previous */
        othern += gnext(othern);
      gnext(othern) = cast_int(f - othern);  /* rechain to point to 'f' */
      *f = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      if (gnext(mp) != 0) {
        gnext(f) += cast_int(mp - f);  /* correct 'next' */
        gnext(mp) = 0;  /* now 'mp' is free */
      }
      setempty(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      if (gnext(mp) != 0)
        gnext(f) = cast_int((mp + gnext(mp)) - f);  /* chain new position */
      else lua_assert(gnext(f) == 0);
      gnext(mp) = cast_int(f - mp);
      mp = f;
    }
  }
  setnodekey(mp, key);
  lua_assert(isempty(gval(mp)));
  setobj2t(cast(lua_State *, 0), gval(mp), value);
  return 1;
}